

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas0.cpp
# Opt level: O3

float r4_uniform_ab(float a,float b,int *seed)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = *seed;
  if (iVar3 != 0) {
    iVar1 = (iVar3 % 0x1f31d) * 0x41a7;
    iVar3 = (iVar3 / 0x1f31d) * -0xb14;
    iVar2 = iVar1 + iVar3;
    iVar3 = iVar1 + iVar3 + 0x7fffffff;
    if (-1 < iVar2) {
      iVar3 = iVar2;
    }
    *seed = iVar3;
    return (b - a) * (float)iVar3 * 4.656613e-10 + a;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"R4_UNIFORM_AB - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  Input value of SEED = 0.\n");
  exit(1);
}

Assistant:

float r4_uniform_ab ( float a, float b, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    R4_UNIFORM_AB returns a scaled pseudorandom R4.
//
//  Discussion:
//
//    The pseudorandom number should be uniformly distributed
//    between A and B.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    21 November 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, float A, B, the limits of the interval.
//
//    Input/output, int &SEED, the "seed" value, which should NOT be 0.
//    On output, SEED has been updated.
//
//    Output, float R4_UNIFORM_AB, a number strictly between A and B.
//
{
  int i4_huge = 2147483647;
  int k;
  float value;

  if ( seed == 0 )
  {
    cerr << "\n";
    cerr << "R4_UNIFORM_AB - Fatal error!\n";
    cerr << "  Input value of SEED = 0.\n";
    exit ( 1 );
  }

  k = seed / 127773;

  seed = 16807 * ( seed - k * 127773 ) - k * 2836;

  if ( seed < 0 )
  {
    seed = seed + i4_huge;
  }

  value = static_cast<float>(seed) * 4.656612875E-10;

  value = a + ( b - a ) * value;

  return value;
}